

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int local_64;
  string local_60;
  path local_40;
  
  local_64 = argc;
  std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
            (&local_40,(char (*) [5])"data",auto_format);
  std::filesystem::create_directory(&local_40);
  std::filesystem::__cxx11::path::~path(&local_40);
  std::filesystem::__cxx11::path::path<char[11],std::filesystem::__cxx11::path>
            (&local_40,(char (*) [11])"data/3DGen",auto_format);
  std::filesystem::create_directory(&local_40);
  std::filesystem::__cxx11::path::~path(&local_40);
  if (argc == 1) {
    UI::interactive_mode();
  }
  else {
    UI::argument_mode(&local_64,argv);
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Katana Exited.","");
  UI::print_ln(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    //create data folder if doesn't exist
    std::filesystem::create_directory("data");
    std::filesystem::create_directory("data/3DGen");
    if (argc==1)
    {
        UI::interactive_mode();
    }
    else
    {
        UI::argument_mode(argc, argv);
    }
    UI::print_ln("Katana Exited.");
    return 0;
}